

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPrePartialsStates
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          int *states2,float *matrices2,int startPattern,int endPattern)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  long in_RCX;
  uint *puVar8;
  long in_RDX;
  long in_RSI;
  float *in_RDI;
  long in_R8;
  long in_R9;
  int j;
  float MjPj;
  float *matrices1Ptr;
  int i;
  int state2;
  int w;
  int k;
  float *destPtr;
  float *partials1Ptr;
  int matrixOffset;
  int v;
  int l;
  float *tmpdestPtr;
  int stateCountModFour;
  int matrixIncr;
  undefined4 in_stack_ffffffffffffff80;
  int iVar9;
  undefined4 in_stack_ffffffffffffff84;
  int local_70;
  int local_68;
  int local_64;
  uint *local_60;
  long local_58;
  int local_48;
  uint *local_40;
  
  fVar1 = in_RDI[9];
  fVar2 = in_RDI[9];
  std::fill<float*,int>
            ((float *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_RDI,
             (int *)0x1a691d);
  for (local_48 = 0; local_48 < (int)in_RDI[0xd]; local_48 = local_48 + 1) {
    iVar6 = local_48 * (int)in_RDI[0xb] * (int)in_RDI[5] + (int)in_RDI[0xb] * j;
    fVar3 = in_RDI[0x10];
    local_58 = in_RDX + (long)iVar6 * 4;
    local_60 = (uint *)(in_RSI + (long)iVar6 * 4);
    for (local_64 = j; local_64 < (int)matrices1Ptr; local_64 = local_64 + 1) {
      local_68 = local_48 * (int)in_RDI[0x10];
      iVar6 = *(int *)(in_R8 + (long)local_64 * 4);
      for (local_70 = 0; local_70 < (int)in_RDI[9]; local_70 = local_70 + 1) {
        lVar7 = in_RCX + (long)(local_48 * (int)fVar3) * 4 + (long)(local_70 * ((int)fVar1 + 1)) * 4
        ;
        local_40 = local_60;
        fVar4 = *(float *)(in_R9 + (long)(local_68 + iVar6) * 4) *
                *(float *)(local_58 + (long)local_70 * 4);
        for (iVar9 = 0; iVar9 < (int)fVar2 / 4 << 2; iVar9 = iVar9 + 4) {
          auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar4),ZEXT416(*(uint *)(lVar7 + (long)iVar9 * 4)),
                                   ZEXT416(*local_40));
          *local_40 = auVar5._0_4_;
          auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar4),
                                   ZEXT416(*(uint *)(lVar7 + (long)(iVar9 + 1) * 4)),
                                   ZEXT416(local_40[1]));
          local_40[1] = auVar5._0_4_;
          puVar8 = local_40 + 3;
          auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar4),
                                   ZEXT416(*(uint *)(lVar7 + (long)(iVar9 + 2) * 4)),
                                   ZEXT416(local_40[2]));
          local_40[2] = auVar5._0_4_;
          local_40 = local_40 + 4;
          auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar4),
                                   ZEXT416(*(uint *)(lVar7 + (long)(iVar9 + 3) * 4)),
                                   ZEXT416(*puVar8));
          *puVar8 = auVar5._0_4_;
        }
        for (; iVar9 < (int)in_RDI[9]; iVar9 = iVar9 + 1) {
          auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar4),ZEXT416(*(uint *)(lVar7 + (long)iVar9 * 4)),
                                   ZEXT416(*local_40));
          *local_40 = auVar5._0_4_;
          local_40 = local_40 + 1;
        }
        local_68 = (int)fVar1 + 1 + local_68;
      }
      local_60 = local_60 + (int)in_RDI[0xb];
      local_58 = local_58 + (long)(int)in_RDI[0xb] * 4;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsStates(REALTYPE* destP,
                                                              const REALTYPE* partials1,
                                                              const REALTYPE* matrices1,
                                                              const int* states2,
                                                              const REALTYPE* matrices2,
                                                              int startPattern,
                                                              int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;
    REALTYPE* tmpdestPtr = destP;
    //clean up the partial first, set every entry to 0
    std::fill(tmpdestPtr, tmpdestPtr + kPartialsSize, 0);

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];

        REALTYPE* destPtr = &destP[v];
        tmpdestPtr = destPtr;
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state2 = states2[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;

                tmpdestPtr = destPtr;
                const REALTYPE  MjPj = matrices2[w + state2] * partials1Ptr[i];

                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    *(tmpdestPtr++) += matrices1Ptr[j + 0] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 1] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 2] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 3] * MjPj;
                }

                for (; j < kStateCount; j++) {
                    *(tmpdestPtr++) += matrices1Ptr[j] * MjPj;
                }

                w += matrixIncr;
            }
            destPtr +=kPartialsPaddedStateCount;
            partials1Ptr += kPartialsPaddedStateCount;
        }
    }

}